

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O1

Extra_MmFixed_t * Extra_MmFixedStart(int nEntrySize)

{
  uint uVar1;
  Extra_MmFixed_t *pEVar2;
  char **ppcVar3;
  
  pEVar2 = (Extra_MmFixed_t *)malloc(0x38);
  pEVar2->nEntrySize = 0;
  pEVar2->nEntriesAlloc = 0;
  pEVar2->nEntriesUsed = 0;
  pEVar2->nEntriesMax = 0;
  pEVar2->pEntriesFree = (char *)0x0;
  pEVar2->nChunkSize = 0;
  pEVar2->nChunksAlloc = 0;
  *(undefined8 *)&pEVar2->nChunks = 0;
  pEVar2->pChunks = (char **)0x0;
  pEVar2->nMemoryUsed = 0;
  pEVar2->nMemoryAlloc = 0;
  pEVar2->nEntrySize = nEntrySize;
  pEVar2->nEntriesAlloc = 0;
  pEVar2->nEntriesUsed = 0;
  pEVar2->pEntriesFree = (char *)0x0;
  uVar1 = 0x400;
  if (0x3f < nEntrySize) {
    uVar1 = 0x10000 / (uint)nEntrySize;
  }
  pEVar2->nChunkSize = uVar1;
  if (uVar1 < 8) {
    pEVar2->nChunkSize = 8;
  }
  pEVar2->nChunksAlloc = 0x40;
  pEVar2->nChunks = 0;
  ppcVar3 = (char **)malloc(0x200);
  pEVar2->pChunks = ppcVar3;
  pEVar2->nMemoryUsed = 0;
  pEVar2->nMemoryAlloc = 0;
  return pEVar2;
}

Assistant:

Extra_MmFixed_t * Extra_MmFixedStart( int nEntrySize )
{
    Extra_MmFixed_t * p;

    p = ABC_ALLOC( Extra_MmFixed_t, 1 );
    memset( p, 0, sizeof(Extra_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}